

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<int,_3UL>_> *value)

{
  bool bVar1;
  int3 v;
  array<int,_3UL> local_1c;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<int,3ul>(this,&local_1c);
    if (bVar1) {
      *(undefined8 *)&value->contained = local_1c._M_elems._0_8_;
      *(int *)((long)&value->contained + 8) = local_1c._M_elems[2];
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::int3> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::int3 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}